

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O0

void ELFIO::dump::note(ostream *out,int no,Elf_Word type,string *name,void *desc,Elf_Word descsz)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  void *pvVar4;
  note_tag_t *pnVar5;
  note_tag_t *pnVar6;
  pointer pnVar7;
  bool local_d1;
  uint local_a4;
  Elf_Word i;
  __normal_iterator<const_ELFIO::note_tag_t::note_values_t_*,_std::vector<ELFIO::note_tag_t::note_values_t,_std::allocator<ELFIO::note_tag_t::note_values_t>_>_>
  local_78;
  Elf_Word *local_70;
  note_values_t *local_68;
  __normal_iterator<const_ELFIO::note_tag_t::note_values_t_*,_std::vector<ELFIO::note_tag_t::note_values_t,_std::allocator<ELFIO::note_tag_t::note_values_t>_>_>
  local_60;
  note_values_t *local_58;
  __normal_iterator<const_ELFIO::note_tag_t::note_values_t_*,_std::vector<ELFIO::note_tag_t::note_values_t,_std::allocator<ELFIO::note_tag_t::note_values_t>_>_>
  local_50;
  const_iterator type_value;
  note_tag_t *name_group;
  Elf_Word descsz_local;
  void *desc_local;
  string *name_local;
  Elf_Word type_local;
  int no_local;
  ostream *out_local;
  
  name_local._0_4_ = type;
  name_local._4_4_ = no;
  _type_local = out;
  poVar3 = std::operator<<(out,"  [");
  _Var2 = std::setw(2);
  poVar3 = std::operator<<(poVar3,_Var2);
  _Var1 = std::setfill<char>(' ');
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar4,name_local._4_4_);
  std::operator<<(poVar3,"] ");
  pnVar5 = std::begin<ELFIO::note_tag_t_const,8ul>((note_tag_t (*) [8])note_tag_table);
  pnVar6 = std::end<ELFIO::note_tag_t_const,8ul>((note_tag_t (*) [8])note_tag_table);
  type_value._M_current = (note_values_t *)name;
  pnVar5 = std::
           find_if<ELFIO::note_tag_t_const*,ELFIO::dump::note(std::ostream&,int,unsigned_int,std::__cxx11::string_const&,void*,unsigned_int)::_lambda(ELFIO::note_tag_t_const&)_1_>
                     (pnVar5,pnVar6,(anon_class_8_1_898f2789_for__M_pred)name);
  __gnu_cxx::
  __normal_iterator<const_ELFIO::note_tag_t::note_values_t_*,_std::vector<ELFIO::note_tag_t::note_values_t,_std::allocator<ELFIO::note_tag_t::note_values_t>_>_>
  ::__normal_iterator(&local_50);
  pnVar6 = std::end<ELFIO::note_tag_t_const,8ul>((note_tag_t (*) [8])note_tag_table);
  if (pnVar5 != pnVar6) {
    local_60._M_current =
         (note_values_t *)
         std::
         vector<ELFIO::note_tag_t::note_values_t,_std::allocator<ELFIO::note_tag_t::note_values_t>_>
         ::begin(&pnVar5->values);
    local_68 = (note_values_t *)
               std::
               vector<ELFIO::note_tag_t::note_values_t,_std::allocator<ELFIO::note_tag_t::note_values_t>_>
               ::end(&pnVar5->values);
    local_70 = (Elf_Word *)&name_local;
    local_58 = (note_values_t *)
               std::
               find_if<__gnu_cxx::__normal_iterator<ELFIO::note_tag_t::note_values_t_const*,std::vector<ELFIO::note_tag_t::note_values_t,std::allocator<ELFIO::note_tag_t::note_values_t>>>,ELFIO::dump::note(std::ostream&,int,unsigned_int,std::__cxx11::string_const&,void*,unsigned_int)::_lambda(ELFIO::note_tag_t::note_values_t_const&)_1_>
                         (local_60,(__normal_iterator<const_ELFIO::note_tag_t::note_values_t_*,_std::vector<ELFIO::note_tag_t::note_values_t,_std::allocator<ELFIO::note_tag_t::note_values_t>_>_>
                                    )local_68,(anon_class_8_1_89923c38_for__M_pred)local_70);
    local_50 = (__normal_iterator<const_ELFIO::note_tag_t::note_values_t_*,_std::vector<ELFIO::note_tag_t::note_values_t,_std::allocator<ELFIO::note_tag_t::note_values_t>_>_>
                )local_58;
  }
  pnVar6 = std::end<ELFIO::note_tag_t_const,8ul>((note_tag_t (*) [8])note_tag_table);
  local_d1 = false;
  if (pnVar5 != pnVar6) {
    local_78._M_current =
         (note_values_t *)
         std::
         vector<ELFIO::note_tag_t::note_values_t,_std::allocator<ELFIO::note_tag_t::note_values_t>_>
         ::end(&pnVar5->values);
    local_d1 = __gnu_cxx::operator!=(&local_50,&local_78);
  }
  poVar3 = _type_local;
  if (local_d1 == false) {
    _Var2 = std::setw(0xc);
    poVar3 = std::operator<<(poVar3,_Var2);
    _Var1 = std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::left);
    poVar3 = std::operator<<(poVar3,(string *)name);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"0x");
    _Var2 = std::setw(8);
    poVar3 = std::operator<<(poVar3,_Var2);
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,descsz);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"0x");
    _Var2 = std::setw(8);
    poVar3 = std::operator<<(poVar3,_Var2);
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    std::ostream::operator<<(pvVar4,(Elf_Word)name_local);
  }
  else {
    _Var2 = std::setw(0xc);
    poVar3 = std::operator<<(poVar3,_Var2);
    _Var1 = std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::left);
    poVar3 = std::operator<<(poVar3,(string *)pnVar5);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"0x");
    _Var2 = std::setw(8);
    poVar3 = std::operator<<(poVar3,_Var2);
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,descsz);
    poVar3 = std::operator<<(poVar3," ");
    pnVar7 = __gnu_cxx::
             __normal_iterator<const_ELFIO::note_tag_t::note_values_t_*,_std::vector<ELFIO::note_tag_t::note_values_t,_std::allocator<ELFIO::note_tag_t::note_values_t>_>_>
             ::operator->(&local_50);
    poVar3 = std::operator<<(poVar3,(string *)&pnVar7->type_str);
    poVar3 = std::operator<<(poVar3," (");
    pnVar7 = __gnu_cxx::
             __normal_iterator<const_ELFIO::note_tag_t::note_values_t_*,_std::vector<ELFIO::note_tag_t::note_values_t,_std::allocator<ELFIO::note_tag_t::note_values_t>_>_>
             ::operator->(&local_50);
    poVar3 = std::operator<<(poVar3,(string *)&pnVar7->description);
    std::operator<<(poVar3,")");
  }
  if (descsz != 0) {
    for (local_a4 = 0; local_a4 < descsz; local_a4 = local_a4 + 1) {
      if ((local_a4 & 0xf) == 0) {
        poVar3 = (ostream *)
                 std::ostream::operator<<(_type_local,std::endl<char,std::char_traits<char>>);
        std::operator<<(poVar3,"         ");
      }
      poVar3 = _type_local;
      _Var2 = std::setw(2);
      poVar3 = std::operator<<(poVar3,_Var2);
      _Var1 = std::setfill<char>('0');
      poVar3 = std::operator<<(poVar3,_Var1._M_c);
      pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
      pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
      std::ostream::operator<<(pvVar4,(uint)*(byte *)((long)desc + (ulong)local_a4));
    }
  }
  return;
}

Assistant:

static void note( std::ostream&      out,
                      int                no,
                      Elf_Word           type,
                      const std::string& name,
                      void*              desc,
                      Elf_Word           descsz )
    {
        out << "  [" << DUMP_DEC_FORMAT( 2 ) << no << "] ";

        const auto name_group = std::find_if(
            std::begin( note_tag_table ), std::end( note_tag_table ),
            [&name]( const note_tag_t& entry ) { return entry.name == name; } );

        std::vector<note_tag_t::note_values_t>::const_iterator type_value;
        if ( name_group != std::end( note_tag_table ) ) {
            type_value = std::find_if(
                name_group->values.begin(), name_group->values.end(),
                [&type]( const note_tag_t::note_values_t& e ) {
                    return e.type == type;
                } );
        }

        if ( name_group != std::end( note_tag_table ) &&
             type_value != name_group->values.end() ) {
            out << DUMP_STR_FORMAT( 12 ) << name_group->name << " "
                << DUMP_HEX0x_FORMAT( 8 ) << descsz << " "
                << type_value->type_str << " (" << type_value->description
                << ")";
        }
        else {
            out << DUMP_STR_FORMAT( 12 ) << name << " "
                << DUMP_HEX0x_FORMAT( 8 ) << descsz << " "
                << DUMP_HEX0x_FORMAT( 8 ) << type;
        }

        if ( descsz != 0 ) {
            for ( Elf_Word i = 0; i < descsz; ++i ) {
                if ( i % 16 == 0 ) {
                    out << std::endl << "         ";
                }
                out << DUMP_HEX_FORMAT( 2 )
                    << (uint32_t)( (uint8_t*)( desc ) )[i];
            }
        }
    }